

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.hpp
# Opt level: O0

IPipelineResourceSignature * __thiscall
Diligent::SerializedResourceSignatureImpl::GetDeviceSignature
          (SerializedResourceSignatureImpl *this,DeviceType Type)

{
  bool bVar1;
  int iVar2;
  Char *Message;
  unique_ptr *this_00;
  pointer pPVar3;
  undefined4 extraout_var;
  char (*in_RCX) [40];
  IPipelineResourceSignature *local_68;
  value_type *Wrpr;
  undefined1 local_38 [8];
  string msg;
  DeviceType Type_local;
  SerializedResourceSignatureImpl *this_local;
  
  msg.field_2._12_4_ = Type;
  if (WebGPU < Type) {
    FormatString<char[26],char[40]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"static_cast<Uint32>(Type) < DeviceCount",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDeviceSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/include/SerializedResourceSignatureImpl.hpp"
               ,0x7b);
    std::__cxx11::string::~string((string *)local_38);
  }
  this_00 = (unique_ptr *)
            std::
            array<std::unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>,_7UL>
            ::operator[](&this->m_pDeviceSignatures,(ulong)(uint)msg.field_2._12_4_);
  bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
  if (bVar1) {
    pPVar3 = std::
             unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
             ::operator->((unique_ptr<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
                           *)this_00);
    iVar2 = (*pPVar3->_vptr_PRSWapperBase[2])();
    local_68 = (IPipelineResourceSignature *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_68 = (IPipelineResourceSignature *)0x0;
  }
  return local_68;
}

Assistant:

IPipelineResourceSignature* GetDeviceSignature(DeviceType Type) const
    {
        VERIFY_EXPR(static_cast<Uint32>(Type) < DeviceCount);
        const auto& Wrpr = m_pDeviceSignatures[static_cast<size_t>(Type)];
        return Wrpr ? Wrpr->GetPRS() : nullptr;
    }